

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O1

bool __thiscall google::protobuf::io::Tokenizer::TryConsumeNewline(Tokenizer *this)

{
  bool bVar1;
  
  if (this->report_whitespace_ == true) {
    bVar1 = false;
    if ((this->report_newlines_ == true) && (bVar1 = false, this->current_char_ == '\n')) {
      NextChar(this);
      (this->current_).type = TYPE_NEWLINE;
      bVar1 = true;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool Tokenizer::TryConsumeNewline() {
  if (!report_whitespace_ || !report_newlines_) {
    return false;
  }
  if (TryConsume('\n')) {
    current_.type = TYPE_NEWLINE;
    return true;
  }
  return false;
}